

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_addstr(wchar_t n,wchar_t a,char *buf)

{
  int *piVar1;
  int iVar2;
  wchar_t x;
  term_win *ptVar3;
  wchar_t n_00;
  ulong uVar4;
  wchar_t wVar5;
  ulong uVar6;
  ulong uVar7;
  wchar_t s [1024];
  wchar_t local_1028 [1026];
  
  iVar2 = Term->wid;
  text_mbstowcs(local_1028,buf,L'Ѐ');
  ptVar3 = Term->scr;
  wVar5 = L'\xffffffff';
  if (ptVar3->cu == false) {
    uVar4 = (ulong)(iVar2 + 1);
    if (L'\xffffffff' < n) {
      uVar4 = (ulong)(uint)n;
    }
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar6 = 0;
      do {
        uVar7 = uVar6;
        if (local_1028[uVar6] == L'\0') break;
        uVar6 = uVar6 + 1;
        uVar7 = uVar4;
      } while (uVar4 != uVar6);
    }
    x = ptVar3->cx;
    wVar5 = iVar2 - x;
    n_00 = wVar5;
    if (x + (wchar_t)uVar7 < iVar2) {
      wVar5 = L'\0';
      n_00 = (wchar_t)uVar7;
    }
    Term_queue_chars(x,ptVar3->cy,n_00,a,local_1028);
    ptVar3 = Term->scr;
    piVar1 = &ptVar3->cx;
    *piVar1 = *piVar1 + n_00;
    if (wVar5 != L'\0') {
      ptVar3->cu = true;
    }
  }
  return wVar5;
}

Assistant:

errr Term_addstr(int n, int a, const char *buf)
{
	int k;

	int w = Term->wid;

	errr res = 0;

	wchar_t s[1024];

	/* Copy to a rewriteable string */
 	text_mbstowcs(s, buf, 1024);

	/* Handle "unusable" cursor */
	if (Term->scr->cu) return (-1);

	/* Obtain maximal length */
	k = (n < 0) ? (w + 1) : n;

	/* Obtain the usable string length */
	for (n = 0; (n < k) && s[n]; n++) /* loop */;

	/* React to reaching the edge of the screen */
	if (Term->scr->cx + n >= w) res = n = w - Term->scr->cx;

	/* Queue the first "n" characters for display */
	Term_queue_chars(Term->scr->cx, Term->scr->cy, n, a, s);

	/* Advance the cursor */
	Term->scr->cx += n;

	/* Hack -- Notice "Useless" cursor */
	if (res) Term->scr->cu = 1;

	/* Success (usually) */
	return (res);
}